

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppm.cpp
# Opt level: O0

void embree::storePPM(Ref<embree::Image> *img,FileName *fileName)

{
  undefined8 uVar1;
  char *pcVar2;
  ostream *poVar3;
  void *pvVar4;
  long *in_RDI;
  Color4 c;
  size_t x;
  size_t y;
  fstream file;
  float local_420;
  float local_41c;
  float local_400;
  float local_3fc;
  float local_3e0;
  float local_3dc;
  undefined4 local_340;
  undefined4 local_33c;
  undefined4 local_338;
  undefined4 local_334;
  undefined4 local_330;
  undefined4 local_32c;
  float local_328;
  float local_324;
  float local_320 [4];
  ulong local_310;
  ulong local_308;
  long local_2f0 [2];
  ostream local_2e0 [520];
  long *local_d8;
  long *local_d0;
  long *local_c8;
  long *local_c0;
  long *local_b8;
  long *local_b0;
  undefined4 *local_a8;
  undefined4 *local_a0;
  float *local_98;
  undefined4 *local_90;
  undefined4 *local_88;
  float *local_80;
  undefined4 *local_78;
  undefined4 *local_70;
  float *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_10;
  float local_8;
  
  local_d8 = in_RDI;
  std::fstream::fstream(local_2f0);
  uVar1 = *(undefined8 *)(local_2f0[0] + -0x18);
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((int)local_2f0 + (int)uVar1);
  pcVar2 = FileName::c_str((FileName *)0x46119b);
  std::operator|(_S_out,_S_bin);
  std::fstream::open((char *)local_2f0,(_Ios_Openmode)pcVar2);
  poVar3 = std::operator<<(local_2e0,"P6");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_b0 = local_d8;
  poVar3 = (ostream *)std::ostream::operator<<(local_2e0,*(ulong *)(*local_d8 + 0x10));
  poVar3 = std::operator<<(poVar3," ");
  local_b8 = local_d8;
  pvVar4 = (void *)std::ostream::operator<<(poVar3,*(ulong *)(*local_d8 + 0x18));
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  pvVar4 = (void *)std::ostream::operator<<(local_2e0,0xff);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  for (local_308 = 0; local_c0 = local_d8, local_308 < *(ulong *)(*local_d8 + 0x18);
      local_308 = local_308 + 1) {
    for (local_310 = 0; local_c8 = local_d8, local_310 < *(ulong *)(*local_d8 + 0x10);
        local_310 = local_310 + 1) {
      local_d0 = local_d8;
      (**(code **)(*(long *)*local_d8 + 0x20))(&local_328,(long *)*local_d8,local_310,local_308);
      local_68 = &local_328;
      local_50 = &zero;
      local_32c = 0;
      local_38 = &one;
      local_330 = 0x3f800000;
      local_70 = &local_32c;
      local_78 = &local_330;
      local_18 = 1.0;
      local_3dc = local_18;
      if (local_328 < 1.0) {
        local_3dc = local_328;
      }
      local_30 = 0.0;
      local_2c = local_3dc;
      local_3e0 = local_30;
      if (0.0 <= local_3dc) {
        local_3e0 = local_3dc;
      }
      std::operator<<(local_2e0,(uchar)(int)(local_3e0 * 255.0));
      local_80 = &local_324;
      local_58 = &zero;
      local_334 = 0;
      local_40 = &one;
      local_338 = 0x3f800000;
      local_88 = &local_334;
      local_90 = &local_338;
      local_10 = 1.0;
      local_3fc = local_10;
      if (local_324 < 1.0) {
        local_3fc = local_324;
      }
      local_28 = 0.0;
      local_24 = local_3fc;
      local_400 = local_28;
      if (0.0 <= local_3fc) {
        local_400 = local_3fc;
      }
      std::operator<<(local_2e0,(uchar)(int)(local_400 * 255.0));
      local_98 = local_320;
      local_60 = &zero;
      local_33c = 0;
      local_48 = &one;
      local_340 = 0x3f800000;
      local_a0 = &local_33c;
      local_a8 = &local_340;
      local_8 = 1.0;
      local_41c = local_8;
      if (local_320[0] < 1.0) {
        local_41c = local_320[0];
      }
      local_20 = 0.0;
      local_1c = local_41c;
      local_420 = local_20;
      if (0.0 <= local_41c) {
        local_420 = local_41c;
      }
      std::operator<<(local_2e0,(uchar)(int)(local_420 * 255.0));
    }
  }
  std::fstream::~fstream(local_2f0);
  return;
}

Assistant:

void storePPM(const Ref<Image>& img, const FileName& fileName)
  {
    /* open file for writing */
    std::fstream file;
    file.exceptions (std::fstream::failbit | std::fstream::badbit);
    file.open (fileName.c_str(), std::fstream::out | std::fstream::binary);

    /* write file header */
    file << "P6" << std::endl;
    file << img->width << " " << img->height << std::endl;
    file << 255 << std::endl;

    /* write image */
    for (size_t y=0; y<img->height; y++) {
      for (size_t x=0; x<img->width; x++) {
        const Color4 c = img->get(x,y);
        file << (unsigned char)(clamp(c.r)*255.0f);
        file << (unsigned char)(clamp(c.g)*255.0f);
        file << (unsigned char)(clamp(c.b)*255.0f);
      }
    }
  }